

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ymz280b.c
# Opt level: O1

void device_reset_ymz280b(void *info)

{
  long lVar1;
  int iVar2;
  int iVar3;
  bool bVar4;
  
  iVar3 = 0xff;
  iVar2 = 0x7c;
  do {
    if (0x75 < iVar3 - 0x88U && iVar2 != 0) {
      *(char *)((long)info + 0x280) = (char)iVar2 + -0x7d;
      write_to_register((ymz280b_state *)info,'\0');
    }
    bVar4 = iVar3 != 0;
    iVar3 = iVar3 + -1;
    iVar2 = iVar2 + -1;
  } while (bVar4);
  *(undefined2 *)((long)info + 0x280) = 0;
  *(undefined4 *)((long)info + 0x290) = 0;
  lVar1 = 0x66;
  do {
    *(undefined8 *)((long)info + lVar1 + -6) = 0x4000;
    *(undefined1 *)((long)info + lVar1 + -0x46) = 0;
    lVar1 = lVar1 + 0x4c;
  } while (lVar1 != 0x2c6);
  return;
}

Assistant:

static void device_reset_ymz280b(void *info)
{
	ymz280b_state *chip = (ymz280b_state *)info;
	int i;

	/* initial clear registers */
	for (i = 0xff; i >= 0; i--)
	{
		if (i == 0x83 || (i >= 0x88 && i <= 0xFD))
			continue;	// avoid too many debug messages
		chip->current_register = i;
		write_to_register(chip, 0);
	}

	chip->current_register = 0;
	chip->status_register = 0;
	chip->ext_mem_address = 0;

	/* clear other voice parameters */
	for (i = 0; i < 8; i++)
	{
		struct YMZ280BVoice *voice = &chip->voice[i];

		voice->curr_sample = 0;
		voice->last_sample = 0;
		voice->output_pos = FRAC_ONE;
		voice->playing = 0;
	}
	
	return;
}